

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueAttribute
          (GLCompiledProgram *this,ShaderSpecAttribute *newAttribute)

{
  pointer pGVar1;
  __type _Var2;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  GLShaderAttribute local_58;
  
  __lhs = (this->attributes).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar1) {
      std::__cxx11::string::string((string *)&local_58,(string *)newAttribute);
      local_58.type = newAttribute->type;
      local_58.arrayCount = newAttribute->arrayCount;
      local_58.buff.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_58.buff.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderAttribute>
                (&this->attributes,&local_58);
      GLShaderAttribute::~GLShaderAttribute(&local_58);
      return;
    }
    _Var2 = std::operator==(&__lhs->name,&newAttribute->name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->type == newAttribute->type) {
    return;
  }
  std::operator+(&local_58.name,"attribute ",&__lhs->name);
  std::operator+(&bStack_78,&local_58.name," appears twice in program with different types");
  exception(&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name) {

      // if it occurs twice, confirm that the occurences match
      if (a.type != newAttribute.type)
        exception("attribute " + a.name + " appears twice in program with different types");

      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, nullptr});
}